

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O3

double __thiscall soinn::ESOINN::densityThershold(ESOINN *this,double mean,double max)

{
  double dVar1;
  
  dVar1 = 0.0;
  if (mean + mean < max) {
    if ((max <= mean * 3.0) && (mean + mean < max)) {
      return 0.5;
    }
    dVar1 = 1.0;
  }
  return dVar1;
}

Assistant:

double ESOINN::densityThershold(double mean, double max)
{
    double threshold;
    if(2.0 * mean >= max)
    {
        threshold = 0.0;
    }
    else if(3.0 * mean >= max && max > 2.0 * mean)
    {
        threshold = 0.5;
    }
    else
    {
        threshold = 1.0;
    }
    return threshold;
}